

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Loop.h
# Opt level: O0

Loop * uWS::Loop::get(void *existingNativeLoop)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined1 *puVar3;
  long *plVar4;
  Loop *pLVar5;
  undefined8 *puVar6;
  long lVar7;
  long in_RDI;
  
  pcVar1 = (char *)__tls_get_addr(&PTR_002ab6e0);
  if (*pcVar1 == '\0') {
    uVar2 = __tls_get_addr(&PTR_002abd78);
    __cxa_thread_atexit(LoopCleaner::~LoopCleaner,uVar2,&__dso_handle);
    puVar3 = (undefined1 *)__tls_get_addr(&PTR_002ab6e0);
    *puVar3 = 1;
  }
  plVar4 = (long *)__tls_get_addr(&PTR_002abd78);
  if (*plVar4 == 0) {
    if (in_RDI == 0) {
      pLVar5 = create((void *)0x214be2);
      puVar6 = (undefined8 *)__tls_get_addr(&PTR_002abd78);
      *puVar6 = pLVar5;
      lVar7 = __tls_get_addr(&PTR_002abd78);
      *(undefined1 *)(lVar7 + 8) = 1;
    }
    else {
      pLVar5 = create((void *)0x214bba);
      puVar6 = (undefined8 *)__tls_get_addr(&PTR_002abd78);
      *puVar6 = pLVar5;
    }
  }
  puVar6 = (undefined8 *)__tls_get_addr(&PTR_002abd78);
  return (Loop *)*puVar6;
}

Assistant:

static Loop *get(void *existingNativeLoop = nullptr) {
        static thread_local LoopCleaner lazyLoop;
        if (!lazyLoop.loop) {
            /* If we are given a native loop pointer we pass that to uSockets and let it deal with it */
            if (existingNativeLoop) {
                /* Todo: here we want to pass the pointer, not a boolean */
                lazyLoop.loop = create(existingNativeLoop);
                /* We cannot register automatic free here, must be manually done */
            } else {
                lazyLoop.loop = create(nullptr);
                lazyLoop.cleanMe = true;
            }
        }

        return lazyLoop.loop;
    }